

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Accumulator.hpp
# Opt level: O2

void __thiscall
OpenMD::Utils::Accumulator<OpenMD::Vector<double,_3U>_>::add
          (Accumulator<OpenMD::Vector<double,_3U>_> *this,Vector<double,_3U> *val)

{
  double dVar1;
  double dVar2;
  size_t i;
  size_t sVar3;
  long lVar4;
  double dVar5;
  undefined1 auVar6 [16];
  
  sVar3 = this->Count_ + 1;
  this->Count_ = sVar3;
  auVar6._8_4_ = (int)(sVar3 >> 0x20);
  auVar6._0_8_ = sVar3;
  auVar6._12_4_ = 0x45300000;
  dVar5 = (auVar6._8_8_ - 1.9342813113834067e+25) +
          ((double)CONCAT44(0x43300000,(int)sVar3) - 4503599627370496.0);
  for (lVar4 = 0; lVar4 != 3; lVar4 = lVar4 + 1) {
    dVar1 = val->data_[lVar4];
    (this->Val_).data_[lVar4] = dVar1;
    (this->Total_).data_[lVar4] = dVar1 + (this->Total_).data_[lVar4];
    dVar1 = (this->Avg_).data_[lVar4];
    dVar2 = (this->Avg2_).data_[lVar4];
    (this->Avg_).data_[lVar4] = (val->data_[lVar4] - dVar1) / dVar5 + dVar1;
    (this->Avg2_).data_[lVar4] = (val->data_[lVar4] * val->data_[lVar4] - dVar2) / dVar5 + dVar2;
  }
  return;
}

Assistant:

void add(const Vector<RealType, Dim>& val) {
      Count_++;

      for (std::size_t i = 0; i < Dim; i++) {
        Val_[i] = val[i];
        Total_[i] += val[i];
        Avg_[i] += (val[i] - Avg_[i]) / static_cast<RealType>(Count_);
        Avg2_[i] +=
            (val[i] * val[i] - Avg2_[i]) / static_cast<RealType>(Count_);
      }
    }